

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_load.c
# Opt level: O0

int lua_dump(lua_State *L,lua_Writer writer,void *data)

{
  TValue *pTVar1;
  cTValue *o;
  void *data_local;
  lua_Writer writer_local;
  lua_State *L_local;
  
  pTVar1 = L->top + -1;
  if (((int)(pTVar1->field_4).it >> 0xf == -9) &&
     (*(char *)((pTVar1->u64 & 0x7fffffffffff) + 10) == '\0')) {
    L_local._4_4_ =
         lj_bcwrite(L,(GCproto *)(*(long *)((pTVar1->u64 & 0x7fffffffffff) + 0x20) + -0x68),writer,
                    data,0);
  }
  else {
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

LUA_API int lua_dump(lua_State *L, lua_Writer writer, void *data)
{
  cTValue *o = L->top-1;
  lj_checkapi(L->top > L->base, "top slot empty");
  if (tvisfunc(o) && isluafunc(funcV(o)))
    return lj_bcwrite(L, funcproto(funcV(o)), writer, data, 0);
  else
    return 1;
}